

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::RequestToken
          (CommissionerImpl *this,Handler<ByteArray> *aHandler,string *aAddr,uint16_t aPort)

{
  char cVar1;
  int iVar2;
  char *to;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  local_d0;
  string local_b0;
  undefined1 local_90 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
  if ((char)iVar2 == '\0') {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "requesting COM_TOK is only valid in CCM Mode";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2c;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    from = "requesting COM_TOK is only valid in CCM Mode";
    write.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_0019a862;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",&local_68);
    }
LAB_0019a862:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"requesting COM_TOK is only valid in CCM Mode",
               (string_view)ZEXT816(0x2c),args);
    local_90._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::operator()(aHandler,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                 (Error *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::function(&local_d0,aHandler);
    TokenManager::RequestToken(&this->mTokenManager,&local_d0,aAddr,aPort);
    std::_Function_base::~_Function_base(&local_d0.super__Function_base);
  }
  return;
}

Assistant:

void CommissionerImpl::RequestToken(Handler<ByteArray> aHandler, const std::string &aAddr, uint16_t aPort)
{
    if (!IsCcmMode())
    {
        aHandler(nullptr, ERROR_INVALID_STATE("requesting COM_TOK is only valid in CCM Mode"));
    }
    else
    {
        mTokenManager.RequestToken(aHandler, aAddr, aPort);
    }
}